

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool convertIterableToVariantMap(QMetaType fromType,void *from,void *to)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  void *in_RSI;
  long in_FS_OFFSET;
  QVariantMap *h;
  const_iterator it;
  const_iterator end;
  QAssociativeIterable map;
  QVariant *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined7 in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  iterator in_stack_ffffffffffffff10;
  QString *in_stack_ffffffffffffff18;
  QMap<QString,_QVariant> *in_stack_ffffffffffffff20;
  bool local_b1;
  QMetaType toType;
  QMetaType fromType_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  toType.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  fromType_00.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  QAssociativeIterable::QAssociativeIterable
            ((QAssociativeIterable *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  QMetaType::fromType<QAssociativeIterable>();
  bVar2 = QMetaType::convert(fromType_00,in_RSI,toType,in_stack_ffffffffffffff00);
  if (bVar2) {
    QMap<QString,_QVariant>::clear
              ((QMap<QString,_QVariant> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    QAssociativeIterable::end((QAssociativeIterable *)in_stack_fffffffffffffed8);
    QAssociativeIterable::begin((QAssociativeIterable *)in_stack_fffffffffffffed8);
    while( true ) {
      uVar3 = QTaggedIterator<QAssociativeConstIterator,_void>::operator!=
                        ((QTaggedIterator<QAssociativeConstIterator,_void> *)
                         CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                         (QTaggedIterator<QAssociativeConstIterator,_void> *)
                         in_stack_fffffffffffffed8);
      if (!(bool)uVar3) break;
      QAssociativeConstIterator::key
                ((QAssociativeConstIterator *)CONCAT17(uVar3,in_stack_fffffffffffffef8));
      QVariant::toString(in_stack_fffffffffffffed8);
      QAssociativeConstIterator::value
                ((QAssociativeConstIterator *)CONCAT17(uVar3,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff10._M_node =
           (_Base_ptr)
           QMap<QString,_QVariant>::insert
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                      in_stack_ffffffffffffff10._M_node);
      QVariant::~QVariant((QVariant *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0))
      ;
      QString::~QString((QString *)0x3899a6);
      QVariant::~QVariant((QVariant *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0))
      ;
      QTaggedIterator<QAssociativeConstIterator,_void>::operator++
                ((QTaggedIterator<QAssociativeConstIterator,_void> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    }
    QTaggedIterator<QAssociativeConstIterator,_void>::~QTaggedIterator
              ((QTaggedIterator<QAssociativeConstIterator,_void> *)0x3898e8);
    local_b1 = true;
    QTaggedIterator<QAssociativeConstIterator,_void>::~QTaggedIterator
              ((QTaggedIterator<QAssociativeConstIterator,_void> *)0x389a46);
  }
  else {
    local_b1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_b1;
  }
  __stack_chk_fail();
}

Assistant:

static bool convertIterableToVariantMap(QMetaType fromType, const void *from, void *to)
{
    QAssociativeIterable map;
    if (!QMetaType::convert(fromType, from, QMetaType::fromType<QAssociativeIterable>(), &map))
        return false;

    QVariantMap &h = *static_cast<QVariantMap *>(to);
    h.clear();
    auto end = map.end();
    for (auto it = map.begin(); it != end; ++it)
        h.insert(it.key().toString(), it.value());
    return true;
}